

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intMan.c
# Opt level: O0

void Inter_ManStop(Inter_Man_t *p,int fProved)

{
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  int fProved_local;
  Inter_Man_t *p_local;
  
  if (p->fVerbose != 0) {
    p->timeOther = ((((p->timeTotal - p->timeRwr) - p->timeCnf) - p->timeSat) - p->timeInt) -
                   p->timeEqu;
    printf("Runtime statistics:\n");
    Abc_Print(1,"%s =","Rewriting  ");
    if (p->timeTotal == 0) {
      local_28 = 0.0;
    }
    else {
      local_28 = ((double)p->timeRwr * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeRwr * 1.0) / 1000000.0,local_28);
    Abc_Print(1,"%s =","CNF mapping");
    if (p->timeTotal == 0) {
      local_38 = 0.0;
    }
    else {
      local_38 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCnf * 1.0) / 1000000.0,local_38);
    Abc_Print(1,"%s =","SAT solving");
    if (p->timeTotal == 0) {
      local_48 = 0.0;
    }
    else {
      local_48 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSat * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","Interpol   ");
    if (p->timeTotal == 0) {
      local_58 = 0.0;
    }
    else {
      local_58 = ((double)p->timeInt * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeInt * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","Containment");
    if (p->timeTotal == 0) {
      local_68 = 0.0;
    }
    else {
      local_68 = ((double)p->timeEqu * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeEqu * 1.0) / 1000000.0,local_68);
    Abc_Print(1,"%s =","Other      ");
    if (p->timeTotal == 0) {
      local_78 = 0.0;
    }
    else {
      local_78 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_78);
    Abc_Print(1,"%s =","TOTAL      ");
    if (p->timeTotal == 0) {
      local_88 = 0.0;
    }
    else {
      local_88 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_88);
  }
  if (p->vInters != (Vec_Ptr_t *)0x0) {
    Inter_ManInterDump(p,fProved);
  }
  if (p->pCnfAig != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfAig);
  }
  if (p->pAigTrans != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigTrans);
  }
  if (p->pInterNew != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pInterNew);
  }
  Inter_ManClean(p);
  Vec_PtrFreeP(&p->vInters);
  Vec_IntFreeP(&p->vVarsAB);
  if (p != (Inter_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Inter_ManStop( Inter_Man_t * p, int fProved )
{
    if ( p->fVerbose )
    {
        p->timeOther = p->timeTotal-p->timeRwr-p->timeCnf-p->timeSat-p->timeInt-p->timeEqu;
        printf( "Runtime statistics:\n" );
        ABC_PRTP( "Rewriting  ", p->timeRwr,   p->timeTotal );
        ABC_PRTP( "CNF mapping", p->timeCnf,   p->timeTotal );
        ABC_PRTP( "SAT solving", p->timeSat,   p->timeTotal );
        ABC_PRTP( "Interpol   ", p->timeInt,   p->timeTotal );
        ABC_PRTP( "Containment", p->timeEqu,   p->timeTotal );
        ABC_PRTP( "Other      ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL      ", p->timeTotal, p->timeTotal );
    }

    if ( p->vInters )
        Inter_ManInterDump( p, fProved );

    if ( p->pCnfAig )
        Cnf_DataFree( p->pCnfAig );
    if ( p->pAigTrans )
        Aig_ManStop( p->pAigTrans );
    if ( p->pInterNew )
        Aig_ManStop( p->pInterNew );
    Inter_ManClean( p );
    Vec_PtrFreeP( &p->vInters );
    Vec_IntFreeP( &p->vVarsAB );
    ABC_FREE( p );
}